

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  __type _Var1;
  int iVar2;
  ITracker *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_19;
  Ptr<Catch::TestCaseTracking::ITracker> *tracker_local;
  TrackerHasName *this_local;
  
  pIVar3 = Ptr<Catch::TestCaseTracking::ITracker>::operator->(tracker);
  iVar2 = (*(pIVar3->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[4])();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)
  ;
  local_19 = false;
  if (_Var1) {
    pIVar3 = Ptr<Catch::TestCaseTracking::ITracker>::operator->(tracker);
    iVar2 = (*(pIVar3->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])();
    local_19 = SourceLineInfo::operator==
                         ((SourceLineInfo *)(CONCAT44(extraout_var_00,iVar2) + 0x20),
                          &(this->m_nameAndLocation).location);
  }
  return local_19;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return
                    tracker->nameAndLocation().name == m_nameAndLocation.name &&
                    tracker->nameAndLocation().location == m_nameAndLocation.location;
            }